

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf-hash.cpp
# Opt level: O1

hash_manifest_result_t
manifest_verify(string *manifest_file,string *hash_type_str,string *hash_str,string *tensor_name)

{
  char cVar1;
  int iVar2;
  istream *piVar3;
  hash_manifest_result_t hVar4;
  bool bVar5;
  string file_hash;
  string file_hash_type;
  string file_tensor_name;
  string manifest_entry_line;
  istringstream line_stream;
  ifstream file;
  hash_manifest_result_t local_454;
  undefined1 *local_450;
  size_t local_448;
  undefined1 local_440;
  undefined7 uStack_43f;
  undefined1 *local_430;
  size_t local_428;
  undefined1 local_420;
  undefined7 uStack_41f;
  string *local_410;
  string *local_408;
  string *local_400;
  undefined1 *local_3f8;
  size_t local_3f0;
  undefined1 local_3e8;
  undefined7 uStack_3e7;
  undefined1 *local_3d8;
  undefined8 local_3d0;
  undefined1 local_3c8;
  undefined7 uStack_3c7;
  istringstream local_3b8 [120];
  ios_base local_340 [264];
  long local_238 [65];
  
  if (manifest_file->_M_string_length == 0) {
    hVar4 = HASH_MANIFEST_NOT_FOUND;
  }
  else {
    local_408 = tensor_name;
    local_400 = hash_type_str;
    std::ifstream::ifstream((istream *)local_238,(string *)manifest_file,_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    hVar4 = HASH_MANIFEST_NOT_FOUND;
    if (cVar1 != '\0') {
      local_3d8 = &local_3c8;
      local_3d0 = 0;
      local_3c8 = 0;
      local_410 = hash_str;
      do {
        cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_238,(string *)&local_3d8,cVar1);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
          local_454 = HASH_MANIFEST_NOT_FOUND;
          break;
        }
        std::__cxx11::istringstream::istringstream(local_3b8,(string *)&local_3d8,_S_in);
        local_430 = &local_420;
        local_428 = 0;
        local_420 = 0;
        local_450 = &local_440;
        local_448 = 0;
        local_440 = 0;
        local_3f0 = 0;
        local_3e8 = 0;
        local_3f8 = &local_3e8;
        piVar3 = std::operator>>((istream *)local_3b8,(string *)&local_430);
        piVar3 = std::operator>>(piVar3,(string *)&local_450);
        piVar3 = std::operator>>(piVar3,(string *)&local_3f8);
        bVar5 = false;
        if (((((((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) &&
              (bVar5 = false, local_428 == local_400->_M_string_length)) &&
             ((local_428 == 0 ||
              (iVar2 = bcmp(local_430,(local_400->_M_dataplus)._M_p,local_428), iVar2 == 0)))) &&
            (local_3f0 == local_408->_M_string_length)) &&
           ((local_3f0 == 0 ||
            (iVar2 = bcmp(local_3f8,(local_408->_M_dataplus)._M_p,local_3f0), iVar2 == 0)))) {
          bVar5 = true;
          if (local_448 == local_410->_M_string_length) {
            if (local_448 == 0) {
              local_454 = HASH_MANIFEST_OK;
            }
            else {
              iVar2 = bcmp(local_450,(local_410->_M_dataplus)._M_p,local_448);
              local_454 = (iVar2 == 0) + HASH_MANIFEST_MISMATCH;
            }
          }
          else {
            local_454 = HASH_MANIFEST_MISMATCH;
          }
        }
        if (local_3f8 != &local_3e8) {
          operator_delete(local_3f8,CONCAT71(uStack_3e7,local_3e8) + 1);
        }
        if (local_450 != &local_440) {
          operator_delete(local_450,CONCAT71(uStack_43f,local_440) + 1);
        }
        if (local_430 != &local_420) {
          operator_delete(local_430,CONCAT71(uStack_41f,local_420) + 1);
        }
        std::__cxx11::istringstream::~istringstream(local_3b8);
        std::ios_base::~ios_base(local_340);
      } while (!bVar5);
      hVar4 = local_454;
      if (local_3d8 != &local_3c8) {
        operator_delete(local_3d8,CONCAT71(uStack_3c7,local_3c8) + 1);
      }
    }
    std::ifstream::~ifstream(local_238);
  }
  return hVar4;
}

Assistant:

static hash_manifest_result_t manifest_verify(const std::string& manifest_file, const std::string& hash_type_str, const std::string& hash_str, const std::string& tensor_name) {
    if (manifest_file.empty()) {
        return HASH_MANIFEST_NOT_FOUND;
    }

    std::ifstream file(manifest_file);
    if (!file.is_open()) {
        return HASH_MANIFEST_NOT_FOUND;
    }

    std::string manifest_entry_line;
    while (getline(file, manifest_entry_line)) {
        std::istringstream line_stream(manifest_entry_line);
        std::string file_hash_type;
        std::string file_hash;
        std::string file_tensor_name;
        if (line_stream >> file_hash_type >> file_hash >> file_tensor_name) {
            // Line parsed. Check hash validity

            if (file_hash_type != hash_type_str) {
                continue;
            }

            if (file_tensor_name != tensor_name) {
                continue;
            }

            return (file_hash == hash_str) ? HASH_MANIFEST_OK : HASH_MANIFEST_MISMATCH;
        }
    }

    return HASH_MANIFEST_NOT_FOUND;
}